

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

bool __thiscall
TPZTensor<TFad<6,_double>_>::IsZeroTensor(TPZTensor<TFad<6,_double>_> *this,TFad<6,_double> *tol)

{
  TFad<6,_double> *in_RDI;
  REAL RVar1;
  uint i;
  REAL realTol;
  double *b;
  undefined7 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff37;
  double local_b0 [7];
  TFad<6,_double> *in_stack_ffffffffffffff88;
  uint local_70;
  TFad<6,_double> local_60;
  REAL local_20;
  
  TFad<6,_double>::TFad(&local_60,in_RDI);
  RVar1 = TPZExtractVal::val<TFad<6,double>>((TFad<6,_double> *)0x14c43ed);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14c43ff);
  local_70 = 0;
  local_20 = RVar1;
  while( true ) {
    if (5 < local_70) {
      return true;
    }
    TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)&in_RDI->val_,(ulong)local_70);
    b = local_b0;
    fabs<double,6>(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff37 =
         operator>((TFadExpr<TFadFuncAbs<TFad<6,_double>_>_> *)
                   CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),b);
    TFadExpr<TFadFuncAbs<TFad<6,_double>_>_>::~TFadExpr
              ((TFadExpr<TFadFuncAbs<TFad<6,_double>_>_> *)0x14c4467);
    if ((in_stack_ffffffffffffff37 & 1) != 0) break;
    local_70 = local_70 + 1;
  }
  return false;
}

Assistant:

bool IsZeroTensor(T tol = 1.e-9) const {
        REAL realTol = TPZExtractVal::val(tol);
        for (unsigned int i = 0; i < 6; ++i) {
            if (fabs(this->fData[i]) > realTol) {
                return false;
            }
        }
        return true;
    }